

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infoPageAnalyzer_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  string local_290;
  string inputPage;
  infoPageAnalyzer infoAna;
  ifstream fin;
  byte abStack_1f8 [488];
  
  std::__cxx11::string::string((string *)&inputPage,"",(allocator *)&fin);
  std::ifstream::ifstream(&fin,"./testInfo.html",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while ((abStack_1f8[*(long *)(_fin + -0x18)] & 2) == 0) {
      std::istream::get();
      std::__cxx11::string::push_back((char)&inputPage);
    }
  }
  std::ifstream::close();
  infoPageAnalyzer::infoPageAnalyzer(&infoAna,&inputPage);
  infoPageAnalyzer::getComicOriginalName_abi_cxx11_(&local_290,&infoAna);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_290);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_290);
  infoPageAnalyzer::getComicTranslatedName_abi_cxx11_(&local_290,&infoAna);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_290);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_290);
  infoPageAnalyzer::getFirstPicPageURL_abi_cxx11_(&local_290,&infoAna);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_290);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_290);
  iVar2 = infoPageAnalyzer::getTotalPageNumber(&infoAna);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  pageAnalyzer::~pageAnalyzer(&infoAna.super_pageAnalyzer);
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&inputPage);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    std::string inputPage = std::string("");

    std::ifstream fin("./testInfo.html", std::ios::in);
    if(fin.is_open())
    {
        while (!fin.eof())
            inputPage += (char)fin.get();
    }
    fin.close();

    infoPageAnalyzer infoAna = infoPageAnalyzer(inputPage);
    std::cout << infoAna.getComicOriginalName() << std::endl;
    std::cout << infoAna.getComicTranslatedName() << std::endl;
    std::cout << infoAna.getFirstPicPageURL() << std::endl;
    std::cout << infoAna.getTotalPageNumber() << std::endl;

    return 0;
}